

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeButActualCallInGlobal_Test::
~TEST_MockCallTest_expectNoCallInScopeButActualCallInGlobal_Test
          (TEST_MockCallTest_expectNoCallInScopeButActualCallInGlobal_Test *this)

{
  TEST_MockCallTest_expectNoCallInScopeButActualCallInGlobal_Test *this_local;
  
  ~TEST_MockCallTest_expectNoCallInScopeButActualCallInGlobal_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeButActualCallInGlobal)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock("scope1").expectNoCall("lazy");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}